

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

void __thiscall SQVM::CallErrorHandler(SQVM *this,SQObjectPtr *error)

{
  CallInfo *pCVar1;
  SQFunctionProto *this_00;
  SQTable *pSVar2;
  SQInteger SVar3;
  _HashNode **pp_Var4;
  SQObjectPtr out;
  SQObject local_38;
  
  if (this->_debughook_native != (SQDEBUGHOOK)0x0) {
    pCVar1 = this->ci;
    if ((pCVar1->_closure).super_SQObject._type == OT_NATIVECLOSURE) {
      (*this->_debughook_native)
                (this,0x65,"",0,(SQChar *)&((error->super_SQObject)._unVal.pTable)->_firstfree);
    }
    else {
      this_00 = ((pCVar1->_closure).super_SQObject._unVal.pClosure)->_function;
      if (this_00 != (SQFunctionProto *)0x0) {
        if ((this_00->_sourcename).super_SQObject._type == OT_STRING) {
          pp_Var4 = &((this_00->_sourcename).super_SQObject._unVal.pTable)->_firstfree;
        }
        else {
          pp_Var4 = (_HashNode **)0x0;
        }
        pSVar2 = (error->super_SQObject)._unVal.pTable;
        SVar3 = SQFunctionProto::GetLine(this_00,pCVar1->_ip,(int *)0x0,(bool *)0x0);
        (*this->_debughook_native)(this,0x65,(SQChar *)pp_Var4,SVar3,(SQChar *)&pSVar2->_firstfree);
      }
    }
  }
  if ((this->_errorhandler).super_SQObject._type != OT_NULL) {
    local_38._unVal.pTable = (SQTable *)0x0;
    local_38._type = OT_NULL;
    local_38._flags = '\0';
    local_38._5_3_ = 0;
    Push(this,&this->_roottable);
    Push(this,error);
    Call(this,&this->_errorhandler,2,this->_top + -2,(SQObjectPtr *)&local_38,0);
    Pop(this,2);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_38);
  }
  return;
}

Assistant:

void SQVM::CallErrorHandler(SQObjectPtr &error)
{
  if (_debughook_native)
  {
    if (ci->_closure._type == OT_NATIVECLOSURE)
    {
      const SQChar *errStr = _stringval(error);
      _debughook_native(this, _SC('e'), _SC(""), 0, errStr);
    }
    else
    {
      SQFunctionProto *func = _closure(ci->_closure)->_function;
      if (func)
      {
        const SQChar *src = sq_type(func->_sourcename) == OT_STRING ? _stringval(func->_sourcename) : NULL;
        const SQChar *errStr = _stringval(error);
        SQInteger line = func->GetLine(ci->_ip);
        _debughook_native(this, _SC('e'), src, line, errStr);
      }
    }
  }

    if(sq_type(_errorhandler) != OT_NULL) {
        SQObjectPtr out;
        assert(_top+2 <= _stack.size());
        Push(_roottable); Push(error);
        Call(_errorhandler, 2, _top-2, out,SQFalse);
        Pop(2);
    }
}